

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *centroidalMomentumJacobian)

{
  FrameVelocityRepresentation FVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  Position *pPVar6;
  long lVar7;
  pointer peVar8;
  element_type *peVar9;
  Index row;
  long lVar10;
  element_type *peVar11;
  pointer peVar12;
  element_type *peVar13;
  element_type *peVar14;
  long lVar15;
  Position com;
  Transform com_T_base_in_base;
  element_type *local_268 [3];
  KinDynComputations local_250;
  Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
  local_238;
  Position local_1f0 [24];
  Transform local_1d8 [96];
  MatrixView<double> local_178;
  Rotation local_148 [288];
  
  if ((centroidalMomentumJacobian->m_rows == 6) &&
     (lVar2 = centroidalMomentumJacobian->m_cols, lVar5 = iDynTree::Model::getNrOfDOFs(),
     lVar2 == lVar5 + 6)) {
    local_178.m_storage = centroidalMomentumJacobian->m_storage;
    local_178.m_rows = centroidalMomentumJacobian->m_rows;
    local_178.m_cols = centroidalMomentumJacobian->m_cols;
    local_178.m_storageOrder = centroidalMomentumJacobian->m_storageOrder;
    local_178.m_innerStride = centroidalMomentumJacobian->m_innerStride;
    local_178.m_outerStride = centroidalMomentumJacobian->m_outerStride;
    bVar4 = getLinearAngularMomentumJacobian(this,&local_178);
    if (bVar4) {
      getCenterOfMassPosition(&local_250);
      iDynTree::FreeFloatingPos::worldBasePos();
      pPVar6 = (Position *)iDynTree::Transform::getPosition();
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      FVar1 = this->pimpl->m_frameVelRepr;
      if (FVar1 == INERTIAL_FIXED_REPRESENTATION) {
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-((Position *)&local_238);
        iDynTree::Transform::Transform(local_1d8,local_148,(Position *)&local_238);
        iDynTree::Transform::asAdjointTransformWrench();
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_238.m_rhs.m_stride.m_inner.m_value = 1;
        if (bVar4) {
          local_238.m_rhs.m_stride.m_inner.m_value =
               local_238.m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_238.m_rhs.m_stride.m_outer.m_value =
             local_238.m_rhs.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_cols.m_value;
        if (bVar4) {
          local_238.m_rhs.m_stride.m_outer.m_value = 1;
        }
        local_238.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)local_148;
        Eigen::Matrix<double,6,-1,0,6,-1>::
        Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
                  ((Matrix<double,6,_1,0,6,_1> *)local_268,&local_238);
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        lVar2 = centroidalMomentumJacobian->m_rows;
        lVar5 = 1;
        if (bVar4) {
          lVar5 = lVar2;
        }
        lVar3 = centroidalMomentumJacobian->m_cols;
        lVar15 = 1;
        if (!bVar4) {
          lVar15 = lVar3;
        }
        if (0 < lVar2) {
          peVar9 = centroidalMomentumJacobian->m_storage;
          lVar10 = 0;
          peVar11 = local_268[0];
          do {
            lVar7 = lVar3;
            peVar13 = peVar9;
            peVar14 = peVar11;
            if (0 < lVar3) {
              do {
                *peVar13 = *peVar14;
                peVar14 = peVar14 + 6;
                peVar13 = peVar13 + lVar5;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
            lVar10 = lVar10 + 1;
            peVar11 = peVar11 + 1;
            peVar9 = peVar9 + lVar15;
          } while (lVar10 != lVar2);
        }
      }
      else if (FVar1 == MIXED_REPRESENTATION) {
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-((Position *)&local_238,pPVar6);
        iDynTree::Transform::Transform(local_1d8,local_148,(Position *)&local_238);
        iDynTree::Transform::asAdjointTransformWrench();
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_238.m_rhs.m_stride.m_inner.m_value = 1;
        if (bVar4) {
          local_238.m_rhs.m_stride.m_inner.m_value =
               local_238.m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_238.m_rhs.m_stride.m_outer.m_value =
             local_238.m_rhs.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_cols.m_value;
        if (bVar4) {
          local_238.m_rhs.m_stride.m_outer.m_value = 1;
        }
        local_238.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)local_148;
        Eigen::Matrix<double,6,-1,0,6,-1>::
        Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
                  ((Matrix<double,6,_1,0,6,_1> *)local_268,&local_238);
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        lVar2 = centroidalMomentumJacobian->m_rows;
        lVar5 = 1;
        if (bVar4) {
          lVar5 = lVar2;
        }
        lVar3 = centroidalMomentumJacobian->m_cols;
        lVar15 = 1;
        if (!bVar4) {
          lVar15 = lVar3;
        }
        if (0 < lVar2) {
          peVar9 = centroidalMomentumJacobian->m_storage;
          lVar10 = 0;
          peVar11 = local_268[0];
          do {
            lVar7 = lVar3;
            peVar13 = peVar9;
            peVar14 = peVar11;
            if (0 < lVar3) {
              do {
                *peVar13 = *peVar14;
                peVar14 = peVar14 + 6;
                peVar13 = peVar13 + lVar5;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
            lVar10 = lVar10 + 1;
            peVar11 = peVar11 + 1;
            peVar9 = peVar9 + lVar15;
          } while (lVar10 != lVar2);
        }
      }
      else {
        if (FVar1 != BODY_FIXED_REPRESENTATION) {
          return false;
        }
        iDynTree::Rotation::Identity();
        iDynTree::Rotation::inverse();
        iDynTree::Position::operator-(local_1f0,pPVar6);
        iDynTree::Rotation::operator*((Rotation *)local_268,(Position *)&local_238);
        iDynTree::Transform::Transform(local_1d8,local_148,(Position *)local_268);
        iDynTree::Transform::asAdjointTransformWrench();
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_238.m_rhs.m_stride.m_inner.m_value = 1;
        if (bVar4) {
          local_238.m_rhs.m_stride.m_inner.m_value =
               local_238.m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_238.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_238.m_rhs.m_stride.m_outer.m_value =
             local_238.m_rhs.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_cols.m_value;
        if (bVar4) {
          local_238.m_rhs.m_stride.m_outer.m_value = 1;
        }
        local_238.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)local_148;
        Eigen::Matrix<double,6,-1,0,6,-1>::
        Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
                  ((Matrix<double,6,_1,0,6,_1> *)local_268,&local_238);
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        lVar2 = centroidalMomentumJacobian->m_rows;
        lVar5 = 1;
        if (bVar4) {
          lVar5 = lVar2;
        }
        lVar3 = centroidalMomentumJacobian->m_cols;
        lVar15 = 1;
        if (!bVar4) {
          lVar15 = lVar3;
        }
        if (0 < lVar2) {
          peVar8 = centroidalMomentumJacobian->m_storage;
          lVar10 = 0;
          peVar9 = local_268[0];
          do {
            lVar7 = lVar3;
            peVar12 = peVar8;
            peVar11 = peVar9;
            if (0 < lVar3) {
              do {
                *peVar12 = *peVar11;
                peVar11 = peVar11 + 6;
                peVar12 = peVar12 + lVar5;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
            lVar10 = lVar10 + 1;
            peVar9 = peVar9 + 1;
            peVar8 = peVar8 + lVar15;
          } while (lVar10 != lVar2);
        }
      }
      free(local_268[0]);
      return true;
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentumJacobian",
               "Wrong size in input centroidalMomentumJacobian");
  }
  return false;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentumJacobian(MatrixView<double> centroidalMomentumJacobian)
{
    bool ok = (centroidalMomentumJacobian.rows() == 6)
        && (centroidalMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getCentroidalTotalMomentumJacobian",
                    "Wrong size in input centroidalMomentumJacobian");
        return false;
    }

    if (!getLinearAngularMomentumJacobian(centroidalMomentumJacobian))
    {
        return false;
    }

    // get CoM and base pose
    Position com = getCenterOfMassPosition();
    const Position& basePosition = pimpl->m_pos.worldBasePos().getPosition();
    const Rotation& A_R_B = pimpl->m_pos.worldBasePos().getRotation();

    switch (pimpl->m_frameVelRepr)
    {
    case BODY_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B). Here we want to
        // express the quantity in (G[B]).
        // J_G[B] = G[B]_X_B * J_B
        // where is G[B]_X_B is the adjoint wrench transformation

        Transform com_T_base_in_base(Rotation::Identity(), A_R_B.inverse() * (basePosition - com));

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_base.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case MIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B[A]). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_B[A] * J_B[A]
        // where is G[A]_X_B[A] is the adjoint wrench transformation

        Transform com_T_base_in_inertial(Rotation::Identity(), basePosition - com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case INERTIAL_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (A). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_A * J_A
        // where is G[A]_X_A is the adjoint wrench transformation
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);

        iDynTree::Transform com_T_inertial(Rotation::Identity(),  -com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    default:
        assert(false);
        return false;
    }

    return true;
}